

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

int32_t tnt_schema_stoiid(tnt_schema *schema_obj,uint32_t sid,char *name,uint32_t name_len)

{
  uint uVar1;
  mh_assoc_t *pmVar2;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  int32_t iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t local_38;
  uint local_34;
  uint32_t sid_local;
  
  pmVar2 = schema_obj->space_hash;
  local_38 = sid;
  local_34 = name_len;
  uVar8 = PMurHash32(0xd,&local_38,4);
  uVar7 = local_34;
  uVar1 = pmVar2->n_buckets;
  uVar12 = (ulong)uVar8 % (ulong)uVar1;
  while( true ) {
    uVar11 = (uint)uVar12;
    if (((((pmVar2->b[uVar12 >> 4] >> (uVar11 & 0xf) & 1) != 0) &&
         ((pmVar2->p[uVar12]->key).id_len == 4)) &&
        (uVar13 = uVar11, local_38 == *(uint32_t *)(pmVar2->p[uVar12]->key).id)) ||
       (uVar13 = uVar1, ((pmVar2->b[uVar12 >> 4] >> (sbyte)(uVar11 & 0xf)) >> 0x10 & 1) == 0))
    break;
    uVar11 = uVar11 + uVar8 % (uVar1 - 1) + 1;
    if (uVar11 < uVar1) {
      uVar13 = 0;
    }
    uVar12 = (ulong)(uVar11 - uVar13);
  }
  iVar10 = -1;
  if (uVar13 != uVar1) {
    pvVar3 = pmVar2->p[uVar13]->data;
    plVar4 = *(long **)((long)pvVar3 + 0x10);
    uVar8 = PMurHash32(0xd,name,local_34);
    uVar1 = *(uint *)(plVar4 + 2);
    uVar12 = (ulong)uVar8 % (ulong)uVar1;
    lVar5 = plVar4[1];
    while( true ) {
      uVar13 = (uint)uVar12;
      uVar11 = *(uint *)(lVar5 + (uVar12 >> 4) * 4);
      if (((((uVar11 >> (uVar13 & 0xf) & 1) != 0) &&
           (puVar6 = *(undefined8 **)(*plVar4 + uVar12 * 8), *(uint *)(puVar6 + 1) == local_34)) &&
          (iVar9 = bcmp(name,(void *)*puVar6,(ulong)uVar7), uVar14 = uVar13, iVar9 == 0)) ||
         (uVar14 = uVar1, ((uVar11 >> (sbyte)(uVar13 & 0xf)) >> 0x10 & 1) == 0)) break;
      uVar13 = uVar13 + uVar8 % (uVar1 - 1) + 1;
      uVar11 = uVar1;
      if (uVar13 < uVar1) {
        uVar11 = 0;
      }
      uVar12 = (ulong)(uVar13 - uVar11);
    }
    plVar4 = *(long **)((long)pvVar3 + 0x10);
    iVar10 = -1;
    if (uVar14 != *(uint *)(plVar4 + 2)) {
      iVar10 = *(int32_t *)(*(long *)(*(long *)(*plVar4 + (ulong)uVar14 * 8) + 0x10) + 0xc);
    }
  }
  return iVar10;
}

Assistant:

int32_t tnt_schema_stoiid(struct tnt_schema *schema_obj, uint32_t sid,
			  const char *name, uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {(void *)&sid, sizeof(uint32_t)};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	struct assoc_key index_key = {name, name_len};
	mh_int_t index_slot = mh_assoc_find(space->index, &index_key, NULL);
	if (index_slot == mh_end(space->index))
		return -1;
	const struct tnt_schema_ival *index =
		(*mh_assoc_node(space->index, index_slot))->data;
	return index->number;
}